

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfile.c
# Opt level: O1

void mtag(memfile *mf,long tagdata,memfile_tagtype tagtype)

{
  int iVar1;
  undefined8 in_RAX;
  memfile_tag *pmVar2;
  mdiff_cmd mVar3;
  int offset;
  int iVar4;
  long lVar5;
  undefined8 uStack_38;
  
  lVar5 = (tagdata * 0x26b + (long)(int)tagtype) % 0x3f1;
  uStack_38 = in_RAX;
  pmVar2 = (memfile_tag *)malloc(0x18);
  pmVar2->next = mf->tags[lVar5];
  pmVar2->tagdata = tagdata;
  pmVar2->tagtype = tagtype;
  pmVar2->pos = mf->pos;
  mf->tags[lVar5] = pmVar2;
  if (mf->relativeto != (memfile *)0x0) {
    for (pmVar2 = mf->relativeto->tags[lVar5]; pmVar2 != (memfile_tag *)0x0; pmVar2 = pmVar2->next)
    {
      if ((pmVar2->tagtype == tagtype) && (pmVar2->tagdata == tagdata)) {
        iVar4 = mf->relativepos - pmVar2->pos;
        if (iVar4 == 0) {
          return;
        }
        if (mf->curcmd != MDIFF_SEEK) {
          mdiffflush(mf);
          mf->curcount = 0;
        }
        iVar1 = mf->curcount + iVar4;
        if ((mf->curcount + iVar4) - 0x2000U < 0xffffc001) {
          do {
            if (iVar1 < 0) {
              uStack_38._0_6_ = CONCAT24(0x2001,(undefined4)uStack_38);
              mdiffwrite(mf,(void *)((long)&uStack_38 + 4),2);
              iVar1 = 0x1fff;
            }
            else {
              uStack_38 = CONCAT26(0x1fff,(undefined6)uStack_38);
              mdiffwrite(mf,(void *)((long)&uStack_38 + 6),2);
              iVar1 = -0x1fff;
            }
            iVar4 = iVar4 + iVar1;
            iVar1 = mf->curcount + iVar4;
          } while ((mf->curcount + iVar4) - 0x2000U < 0xffffc001);
        }
        mVar3 = MDIFF_INVALID;
        if (iVar1 != 0) {
          mVar3 = MDIFF_SEEK;
        }
        mf->curcount = iVar1;
        mf->curcmd = mVar3;
        mf->relativepos = pmVar2->pos;
        return;
      }
    }
  }
  return;
}

Assistant:

void mtag(struct memfile *mf, long tagdata, enum memfile_tagtype tagtype)
{
	/*
	 * 619 is chosen here because it's a prime number, and it's
	 * approximately in the golden ratio with MEMFILE_HASHTABLE_SIZE.
	 */
	int bucket = (tagdata * 619 + (int)tagtype) % MEMFILE_HASHTABLE_SIZE;
	struct memfile_tag *tag = malloc(sizeof(struct memfile_tag));
	tag->next = mf->tags[bucket];
	tag->tagdata = tagdata;
	tag->tagtype = tagtype;
	tag->pos = mf->pos;
	mf->tags[bucket] = tag;

	if (mf->relativeto) {
	    for (tag = mf->relativeto->tags[bucket]; tag; tag = tag->next) {
		if (tag->tagtype == tagtype && tag->tagdata == tagdata)
		    break;
	    }
	    if (tag && mf->relativepos != tag->pos) {
		int offset = mf->relativepos - tag->pos;
		if (mf->curcmd != MDIFF_SEEK) {
		    mdiffflush(mf);
		    mf->curcount = 0;
		}
		while (offset + mf->curcount >=  (1<<13) ||
		       offset + mf->curcount <= -(1<<13)) {
		    if (offset + mf->curcount < 0) {
			mdiffwrite14(mf, MDIFF_SEEK, -0x1fff);
			offset += 0x1fff;
		    } else {
			mdiffwrite14(mf, MDIFF_SEEK, 0x1fff);
			offset -= 0x1fff;
		    }
		}
		mf->curcount += offset;
		mf->curcmd = (mf->curcount ? MDIFF_SEEK : MDIFF_INVALID);
		mf->relativepos = tag->pos;
	    }
	}
}